

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

tcv_t * tcv_create(int index,i2c_read_cb_t read,i2c_write_cb_t write)

{
  int iVar1;
  tcv_t *tcv;
  i2c_write_cb_t write_local;
  i2c_read_cb_t read_local;
  tcv_t *ptStack_10;
  int index_local;
  
  if ((read == (i2c_read_cb_t)0x0) || (write == (i2c_write_cb_t)0x0)) {
    ptStack_10 = (tcv_t *)0x0;
  }
  else {
    ptStack_10 = (tcv_t *)malloc(0x58);
    if (ptStack_10 == (tcv_t *)0x0) {
      ptStack_10 = (tcv_t *)0x0;
    }
    else {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&ptStack_10->lock,(pthread_mutexattr_t *)0x0);
      if (iVar1 < 0) {
        free(ptStack_10);
        ptStack_10 = (tcv_t *)0x0;
      }
      else {
        ptStack_10->index = index;
        ptStack_10->read = read;
        ptStack_10->write = write;
        ptStack_10->created = true;
        ptStack_10->data = (void *)0x0;
        ptStack_10->initialized = false;
      }
    }
  }
  return ptStack_10;
}

Assistant:

tcv_t * tcv_create(int index, i2c_read_cb_t read, i2c_write_cb_t write)
{
	tcv_t * tcv;
	/* Check parameters */
	if (read == NULL || write == NULL)
		return NULL ;

	tcv = (tcv_t*) malloc(sizeof(tcv_t));
	if (!tcv)
		return NULL ;

	/* initialize mutex */
	if (pthread_mutex_init(&tcv->lock, NULL) < 0) {
		free(tcv);
		return NULL ;
	}

	/* Initialize data */
	tcv->index = index;
	/* Provide basic read/write functions */
	tcv->read = read;
	tcv->write = write;
	tcv->created = true;
	/* initialize to be able to check in tcv_is_initialized() */
	tcv->data = NULL;
	tcv->initialized = false;
	return tcv;
}